

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

ValidateXrFlagsResult ValidateXrDigitalLensControlFlagsALMALENCE(XrFlags64 value)

{
  ValidateXrFlagsResult VVar1;
  
  VVar1 = VALIDATE_XR_FLAGS_ZERO;
  if (value != 0) {
    VVar1 = (value == 1) + VALIDATE_XR_FLAGS_INVALID;
  }
  return VVar1;
}

Assistant:

ValidateXrFlagsResult ValidateXrDigitalLensControlFlagsALMALENCE(const XrFlags64 value) {
    if (0 == value) {
        return VALIDATE_XR_FLAGS_ZERO;
    }
    XrFlags64 int_value = value;
    if ((int_value & XR_DIGITAL_LENS_CONTROL_PROCESSING_DISABLE_BIT_ALMALENCE) != 0) {
        // Clear the value XR_DIGITAL_LENS_CONTROL_PROCESSING_DISABLE_BIT_ALMALENCE since it is valid
        int_value &= ~XR_DIGITAL_LENS_CONTROL_PROCESSING_DISABLE_BIT_ALMALENCE;
    }
    if (int_value != 0) {
        // Something is left, it must be invalid
        return VALIDATE_XR_FLAGS_INVALID;
    }
    return VALIDATE_XR_FLAGS_SUCCESS;
}